

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O2

void __thiscall ManySubcommands::ManySubcommands(ManySubcommands *this)

{
  App *pAVar1;
  App *pAVar2;
  long lVar3;
  allocator local_183;
  allocator local_182;
  allocator local_181;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  allocator local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  TApp::TApp(&this->super_TApp);
  (this->super_TApp)._vptr_TApp = (_func_int **)&PTR__TApp_00214fe8;
  this->sub1 = (App *)0x0;
  this->sub2 = (App *)0x0;
  this->sub3 = (App *)0x0;
  this->sub4 = (App *)0x0;
  (this->super_TApp).app.allow_extras_ = true;
  std::__cxx11::string::string((string *)&local_a0,"sub1",local_80);
  std::__cxx11::string::string((string *)&local_c0,"",&local_183);
  pAVar2 = &(this->super_TApp).app;
  pAVar1 = CLI::App::add_subcommand(pAVar2,&local_a0,&local_c0);
  this->sub1 = pAVar1;
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_e0,"sub2",local_80);
  std::__cxx11::string::string((string *)&local_100,"",&local_183);
  pAVar1 = CLI::App::add_subcommand(pAVar2,&local_e0,&local_100);
  this->sub2 = pAVar1;
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string((string *)&local_120,"sub3",local_80);
  std::__cxx11::string::string((string *)&local_140,"",&local_183);
  pAVar1 = CLI::App::add_subcommand(pAVar2,&local_120,&local_140);
  this->sub3 = pAVar1;
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_160,"sub4",local_80);
  std::__cxx11::string::string((string *)&local_180,"",&local_183);
  pAVar2 = CLI::App::add_subcommand(pAVar2,&local_160,&local_180);
  this->sub4 = pAVar2;
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::string((string *)local_80,"sub1",&local_183);
  std::__cxx11::string::string(local_60,"sub2",&local_181);
  std::__cxx11::string::string(local_40,"sub3",&local_182);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,local_80,&stack0xffffffffffffffe0);
  lVar3 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_80 + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  return;
}

Assistant:

ManySubcommands() {
        app.allow_extras();
        sub1 = app.add_subcommand("sub1");
        sub2 = app.add_subcommand("sub2");
        sub3 = app.add_subcommand("sub3");
        sub4 = app.add_subcommand("sub4");
        args = {"sub1", "sub2", "sub3"};
    }